

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O2

string * format_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  uint uVar1;
  char *__s;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong __maxlen;
  bool bVar4;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __maxlen = 0x100;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __s = (char *)malloc(0x100);
  if (__s != (char *)0x0) {
    uVar3 = 1;
    for (bVar4 = false; !bVar4; bVar4 = (bool)(bVar4 | bVar5)) {
      ap[0].reg_save_area = local_e8;
      ap[0].overflow_arg_area = &stack0x00000008;
      ap[0].gp_offset = 0x10;
      ap[0].fp_offset = 0x30;
      uVar1 = vsnprintf(__s,__maxlen,format,ap);
      bVar5 = true;
      if (-1 < (int)uVar1) {
        if (uVar1 < __maxlen) {
          std::__cxx11::string::assign((char *)__return_storage_ptr__);
        }
        else {
          __maxlen = (ulong)(uVar1 + 1);
          pcVar2 = (char *)realloc(__s,__maxlen);
          bVar5 = pcVar2 == (char *)0x0;
          if (!bVar5) {
            __s = pcVar2;
          }
        }
      }
      bVar4 = 5 < uVar3;
      uVar3 = uVar3 + 1;
    }
    free(__s);
  }
  return __return_storage_ptr__;
}

Assistant:

string
format(const char* format, ...)
{
    va_list ap;

    size_t buffer_size_bytes = 256;

    string result;

    char* buffer = (char*)malloc(buffer_size_bytes);

    if( buffer == NULL )
        return result;

    bool done = false;

    unsigned int loop_count = 0;

    while(!done)
    {
        va_start(ap, format);

        int return_value = vsnprintf(buffer, buffer_size_bytes, format, ap);

        if( return_value < 0 )
        {
            done = true;
        }
        else if( return_value >= buffer_size_bytes )
        {
            // Realloc and try again.

            buffer_size_bytes = return_value + 1;

            char* new_buffer_ptr = (char*)realloc(buffer, buffer_size_bytes);

            if( new_buffer_ptr == NULL )
            {
                done = true;
            }
            else
            {
                buffer = new_buffer_ptr;
            }
        }
        else
        {
            result = buffer;
            done = true;
        }

        va_end(ap);

        if( ++loop_count > 5 )
            done = true;
    }

    free(buffer);

    return result;
}